

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::structTypeCheck
          (TParseContext *this,TSourceLoc *param_1,TPublicType *publicType)

{
  bool bVar1;
  int iVar2;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_00;
  size_type sVar3;
  const_reference pvVar4;
  undefined4 extraout_var;
  TSourceLoc *pTVar5;
  undefined4 extraout_var_00;
  char *pcVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TSourceLoc *memberLoc;
  TQualifier *memberQualifier;
  uint member;
  TTypeList *typeList;
  TPublicType *publicType_local;
  TSourceLoc *param_1_local;
  TParseContext *this_local;
  TQualifier *this_01;
  
  this_00 = &TType::getStruct(publicType->userDef)->
             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
  for (memberQualifier._4_4_ = 0;
      sVar3 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                        (this_00), memberQualifier._4_4_ < sVar3;
      memberQualifier._4_4_ = memberQualifier._4_4_ + 1) {
    pvVar4 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator[]
                       (this_00,(ulong)memberQualifier._4_4_);
    iVar2 = (*pvVar4->type->_vptr_TType[10])();
    this_01 = (TQualifier *)CONCAT44(extraout_var,iVar2);
    pvVar4 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator[]
                       (this_00,(ulong)memberQualifier._4_4_);
    pTVar5 = &pvVar4->loc;
    bVar1 = TQualifier::isAuxiliary(this_01);
    if (((bVar1) || (bVar1 = TQualifier::isInterpolation(this_01), bVar1)) ||
       (((*(ulong *)&this_01->field_0x8 & 0x7f) != 0 &&
        (((uint)*(undefined8 *)&this_01->field_0x8 & 0x7f) != 1)))) {
      pvVar4 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](this_00,(ulong)memberQualifier._4_4_);
      iVar2 = (*pvVar4->type->_vptr_TType[6])();
      pcVar6 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var_00,iVar2));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar5,"cannot use storage or interpolation qualifiers on structure members",
                 pcVar6,"");
    }
    bVar1 = TQualifier::isMemory(this_01);
    if (bVar1) {
      pvVar4 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](this_00,(ulong)memberQualifier._4_4_);
      iVar2 = (*pvVar4->type->_vptr_TType[6])();
      pcVar6 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var_01,iVar2));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar5,"cannot use memory qualifiers on structure members",pcVar6,"");
    }
    bVar1 = TQualifier::hasLayout(this_01);
    if (bVar1) {
      pvVar4 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](this_00,(ulong)memberQualifier._4_4_);
      iVar2 = (*pvVar4->type->_vptr_TType[6])();
      pcVar6 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var_02,iVar2));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar5,"cannot use layout qualifiers on structure members",pcVar6,"");
      TQualifier::clearLayout(this_01);
    }
    if ((*(ulong *)&this_01->field_0x8 >> 0x1c & 1) != 0) {
      pvVar4 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](this_00,(ulong)memberQualifier._4_4_);
      iVar2 = (*pvVar4->type->_vptr_TType[6])();
      pcVar6 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         ((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)CONCAT44(extraout_var_03,iVar2));
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,pTVar5,"cannot use invariant qualifier on structure members",pcVar6,"");
    }
  }
  return;
}

Assistant:

void TParseContext::structTypeCheck(const TSourceLoc& /*loc*/, TPublicType& publicType)
{
    const TTypeList& typeList = *publicType.userDef->getStruct();

    // fix and check for member storage qualifiers and types that don't belong within a structure
    for (unsigned int member = 0; member < typeList.size(); ++member) {
        TQualifier& memberQualifier = typeList[member].type->getQualifier();
        const TSourceLoc& memberLoc = typeList[member].loc;
        if (memberQualifier.isAuxiliary() ||
            memberQualifier.isInterpolation() ||
            (memberQualifier.storage != EvqTemporary && memberQualifier.storage != EvqGlobal))
            error(memberLoc, "cannot use storage or interpolation qualifiers on structure members", typeList[member].type->getFieldName().c_str(), "");
        if (memberQualifier.isMemory())
            error(memberLoc, "cannot use memory qualifiers on structure members", typeList[member].type->getFieldName().c_str(), "");
        if (memberQualifier.hasLayout()) {
            error(memberLoc, "cannot use layout qualifiers on structure members", typeList[member].type->getFieldName().c_str(), "");
            memberQualifier.clearLayout();
        }
        if (memberQualifier.invariant)
            error(memberLoc, "cannot use invariant qualifier on structure members", typeList[member].type->getFieldName().c_str(), "");
    }
}